

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

xmlNodePtr xmlReplaceNode(xmlNodePtr old,xmlNodePtr cur)

{
  _xmlNode *p_Var1;
  _xmlNode *p_Var2;
  _xmlNode **pp_Var3;
  
  if (((old == (xmlNodePtr)0x0 || old == cur) || (old->type == XML_NAMESPACE_DECL)) ||
     (old->parent == (_xmlNode *)0x0)) {
    return (xmlNodePtr)0x0;
  }
  if ((cur == (xmlNodePtr)0x0) || (cur->type == XML_NAMESPACE_DECL)) {
    xmlUnlinkNode(old);
    return old;
  }
  if ((cur->type == XML_ATTRIBUTE_NODE) != (old->type == XML_ATTRIBUTE_NODE)) {
    return old;
  }
  xmlUnlinkNode(cur);
  xmlSetTreeDoc(cur,old->doc);
  p_Var1 = old->parent;
  cur->parent = p_Var1;
  p_Var2 = old->next;
  cur->next = p_Var2;
  if (p_Var2 != (_xmlNode *)0x0) {
    p_Var2->prev = cur;
  }
  p_Var2 = old->prev;
  cur->prev = p_Var2;
  if (p_Var2 != (_xmlNode *)0x0) {
    p_Var2->next = cur;
  }
  if (p_Var1 != (_xmlNode *)0x0) {
    if (cur->type == XML_ATTRIBUTE_NODE) {
      if ((xmlNodePtr)p_Var1->properties != old) goto LAB_001804bd;
      pp_Var3 = (_xmlNode **)&p_Var1->properties;
    }
    else {
      if (p_Var1->children == old) {
        p_Var1->children = cur;
      }
      if (p_Var1->last != old) goto LAB_001804bd;
      pp_Var3 = &p_Var1->last;
    }
    *pp_Var3 = cur;
  }
LAB_001804bd:
  old->parent = (_xmlNode *)0x0;
  old->next = (_xmlNode *)0x0;
  old->prev = (_xmlNode *)0x0;
  return old;
}

Assistant:

xmlNodePtr
xmlReplaceNode(xmlNodePtr old, xmlNodePtr cur) {
    if (old == cur) return(NULL);
    if ((old == NULL) || (old->type == XML_NAMESPACE_DECL) ||
        (old->parent == NULL)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlReplaceNode : old == NULL or without parent\n");
#endif
	return(NULL);
    }
    if ((cur == NULL) || (cur->type == XML_NAMESPACE_DECL)) {
	xmlUnlinkNode(old);
	return(old);
    }
    if (cur == old) {
	return(old);
    }
    if ((old->type==XML_ATTRIBUTE_NODE) && (cur->type!=XML_ATTRIBUTE_NODE)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlReplaceNode : Trying to replace attribute node with other node type\n");
#endif
	return(old);
    }
    if ((cur->type==XML_ATTRIBUTE_NODE) && (old->type!=XML_ATTRIBUTE_NODE)) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlReplaceNode : Trying to replace a non-attribute node with attribute node\n");
#endif
	return(old);
    }
    xmlUnlinkNode(cur);
    xmlSetTreeDoc(cur, old->doc);
    cur->parent = old->parent;
    cur->next = old->next;
    if (cur->next != NULL)
	cur->next->prev = cur;
    cur->prev = old->prev;
    if (cur->prev != NULL)
	cur->prev->next = cur;
    if (cur->parent != NULL) {
	if (cur->type == XML_ATTRIBUTE_NODE) {
	    if (cur->parent->properties == (xmlAttrPtr)old)
		cur->parent->properties = ((xmlAttrPtr) cur);
	} else {
	    if (cur->parent->children == old)
		cur->parent->children = cur;
	    if (cur->parent->last == old)
		cur->parent->last = cur;
	}
    }
    old->next = old->prev = NULL;
    old->parent = NULL;
    return(old);
}